

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindowPrivate::setVisible(QWidgetWindowPrivate *this,bool visible)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  QWidgetWindow *this_00;
  QDebug *o;
  QWidget *pQVar5;
  QWidgetPrivate *pQVar6;
  byte in_SIL;
  QWidgetWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QDebug *unaff_retaddr;
  QWidget *widget;
  QWidgetWindow *q;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined1 uVar7;
  QMessageLogger *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffc8;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  QWidget *widget_00;
  
  widget_00 = *(QWidget **)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  this_00 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetShowHide();
  anon_unknown.dwarf_2d15b0::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
    anon_unknown.dwarf_2d15b0::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3b9025);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff90,(char *)in_RDI,in_stack_ffffffffffffff84,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               (char *)0x3b903b);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffc8);
    QDebug::QDebug(&local_28,o);
    QWidgetWindow::widget((QWidgetWindow *)0x3b9072);
    ::operator<<(unaff_retaddr,widget_00);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffc8);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (bool)in_stack_ffffffffffffff7f);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffc8);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    local_10 = 0;
  }
  pQVar5 = QWidgetWindow::widget((QWidgetWindow *)0x3b90e7);
  uVar7 = SUB81(in_RDI,0);
  if (pQVar5 != (QWidget *)0x0) {
    uVar4 = (uint)bVar1;
    bVar2 = QWidget::isVisible((QWidget *)0x3b910b);
    if (uVar4 != bVar2) {
      pQVar6 = QWidgetPrivate::get((QWidget *)0x3b9125);
      (**(code **)(*(long *)pQVar6 + 0x20))(pQVar6,bVar1);
    }
  }
  bVar3 = QWindow::isVisible();
  if ((bVar3 & 1) != bVar1) {
    QWindowPrivate::setVisible((bool)uVar7);
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != widget_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setVisible(bool visible) override
    {
        Q_Q(QWidgetWindow);
        qCDebug(lcWidgetShowHide) << "Setting visibility of" << q->widget()
               << "to" << visible << "via QWidgetWindowPrivate";

        if (QWidget *widget = q->widget()) {
            // If the widget's visible state is already matching the new QWindow
            // visible state we assume the widget has already synced up.
            if (visible != widget->isVisible())
                QWidgetPrivate::get(widget)->setVisible(visible);
        }

        // If we end up calling QWidgetPrivate::setVisible() above, we will
        // in most cases recurse back into setNativeWindowVisibility() to
        // update the QWindow state. But during QWidget::destroy() this is
        // not the case, as Qt::WA_WState_Created has been unset by the time
        // we check if we should call hide_helper(). We handle this case, as
        // well as the cases where we don't call QWidgetPrivate::setVisible(),
        // by syncing up the QWindow state here if needed.
        if (q->isVisible() != visible)
            QWindowPrivate::setVisible(visible);
    }